

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstylesheetstyle.cpp
# Opt level: O1

QList<QCss::StyleRule> * __thiscall
QStyleSheetStyle::styleRules
          (QList<QCss::StyleRule> *__return_storage_ptr__,QStyleSheetStyle *this,QObject *obj)

{
  StyleSheet *pSVar1;
  byte bVar2;
  Span *pSVar3;
  Entry *pEVar4;
  Data *pDVar5;
  Span *pSVar6;
  Entry *pEVar7;
  int *piVar8;
  QStyleSheetStyleCaches *pQVar9;
  StyleRule *pSVar10;
  Data *pDVar11;
  MediaRule *pMVar12;
  Data *pDVar13;
  PageRule *pPVar14;
  Data *pDVar15;
  AnimationRule *pAVar16;
  Data *pDVar17;
  ImportRule *pIVar18;
  Data *pDVar19;
  qsizetype qVar20;
  undefined4 uVar21;
  undefined4 uVar22;
  void *pvVar23;
  StyleRule *pSVar24;
  Data *pDVar25;
  MediaRule *pMVar26;
  Data *pDVar27;
  PageRule *pPVar28;
  Data *pDVar29;
  AnimationRule *pAVar30;
  Data *pDVar31;
  ImportRule *pIVar32;
  Data *pDVar33;
  qsizetype qVar34;
  bool bVar35;
  char cVar36;
  QStyle *pQVar37;
  undefined4 *puVar38;
  QObject *obj_00;
  QDebug *pQVar39;
  pointer pSVar40;
  ulong uVar41;
  QHash<const_void_*,_QCss::StyleSheet> *this_00;
  int iVar42;
  CaseSensitivity CVar43;
  QStyleSheetStyle *this_01;
  int iVar44;
  undefined1 *puVar45;
  long lVar46;
  long in_FS_OFFSET;
  const_iterator cVar47;
  const_iterator cVar48;
  QLatin1String QVar49;
  QStringView QVar50;
  QStringView QVar51;
  Stream *local_250;
  undefined1 local_248 [8];
  QString local_240;
  QArrayData *local_228;
  undefined1 *puStack_220;
  undefined1 *local_218;
  void *copy_1;
  StyleSheet *pSStack_200;
  undefined1 *local_1f8;
  QObject local_1f0 [8];
  StyleSheet local_1e8;
  QStyleSheetStyleSelector styleSelector;
  QObject *obj_local;
  QMultiHash<QString,_QCss::StyleRule> moved;
  void *copy;
  StyleRule *local_d0;
  long lStack_c8;
  QArrayDataPointer<QCss::MediaRule> local_c0;
  QArrayDataPointer<QCss::PageRule> local_a8;
  QArrayDataPointer<QCss::AnimationRule> local_90;
  QArrayDataPointer<QCss::ImportRule> local_78;
  undefined8 local_60;
  QMultiHash<QString,_QCss::StyleRule> local_58;
  QMultiHash<QString,_QCss::StyleRule> local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = (QStyleSheetStyle *)&styleSheetCaches->styleRulesCache;
  obj_local = obj;
  cVar47 = QHash<QObject_const*,QList<QCss::StyleRule>>::constFindImpl<QObject_const*>
                     ((QHash<QObject_const*,QList<QCss::StyleRule>> *)this_01,&obj_local);
  if (cVar47.i.d == (Data<QHashPrivate::Node<const_QObject_*,_QList<QCss::StyleRule>_>_> *)0x0 &&
      cVar47.i.bucket == 0) {
    bVar35 = initObject(this_01,obj_local);
    if (bVar35) {
      styleSelector._8_8_ = 0;
      styleSelector._16_8_ = 0;
      styleSelector._24_8_ = 0;
      styleSelector._32_8_ = 0;
      styleSelector._40_8_ = 0;
      styleSelector._48_8_ = 0;
      styleSelector._56_8_ = 0xaaaaaaaa00000001;
      styleSelector._0_8_ = &PTR__QStyleSheetStyleSelector_007f8240;
      styleSelector.m_attributeCache.d = (Data *)0x0;
      memset(&local_1e8,0xaa,0xa0);
      memset(&local_1e8,0,0xa0);
      this_00 = &styleSheetCaches->styleSheetCache;
      copy = baseStyle(this);
      cVar48 = QHash<void_const*,QCss::StyleSheet>::constFindImpl<void_const*>
                         ((QHash<void_const*,QCss::StyleSheet> *)this_00,&copy);
      if (cVar48.i.d == (Data<QHashPrivate::Node<const_void_*,_QCss::StyleSheet>_> *)0x0 &&
          cVar48.i.bucket == 0) {
        getDefaultStyleSheet((StyleSheet *)&copy,this);
        local_1e8.styleRules.d.size = lStack_c8;
        pSVar24 = local_d0;
        pvVar23 = copy;
        pSVar10 = local_1e8.styleRules.d.ptr;
        pDVar5 = local_1e8.styleRules.d.d;
        copy = (void *)0x0;
        local_d0 = (StyleRule *)0x0;
        lStack_c8 = 0;
        local_1e8.styleRules.d.d = (Data *)pvVar23;
        local_1e8.styleRules.d.ptr = pSVar24;
        moved.d._0_4_ = SUB84(pDVar5,0);
        moved.d._4_4_ = (undefined4)((ulong)pDVar5 >> 0x20);
        moved.m_size._0_4_ = SUB84(pSVar10,0);
        moved.m_size._4_4_ = (undefined4)((ulong)pSVar10 >> 0x20);
        QArrayDataPointer<QCss::StyleRule>::~QArrayDataPointer
                  ((QArrayDataPointer<QCss::StyleRule> *)&moved);
        local_1e8.mediaRules.d.size = local_c0.size;
        pMVar26 = local_c0.ptr;
        pDVar25 = local_c0.d;
        pMVar12 = local_1e8.mediaRules.d.ptr;
        pDVar11 = local_1e8.mediaRules.d.d;
        local_c0.d = (Data *)0x0;
        local_c0.ptr = (MediaRule *)0x0;
        local_c0.size = 0;
        local_1e8.mediaRules.d.d = pDVar25;
        local_1e8.mediaRules.d.ptr = pMVar26;
        moved.d._0_4_ = SUB84(pDVar11,0);
        moved.d._4_4_ = (undefined4)((ulong)pDVar11 >> 0x20);
        moved.m_size._0_4_ = SUB84(pMVar12,0);
        moved.m_size._4_4_ = (undefined4)((ulong)pMVar12 >> 0x20);
        QArrayDataPointer<QCss::MediaRule>::~QArrayDataPointer
                  ((QArrayDataPointer<QCss::MediaRule> *)&moved);
        local_1e8.pageRules.d.size = local_a8.size;
        pPVar28 = local_a8.ptr;
        pDVar27 = local_a8.d;
        pPVar14 = local_1e8.pageRules.d.ptr;
        pDVar13 = local_1e8.pageRules.d.d;
        local_a8.d = (Data *)0x0;
        local_a8.ptr = (PageRule *)0x0;
        local_a8.size = 0;
        local_1e8.pageRules.d.d = pDVar27;
        local_1e8.pageRules.d.ptr = pPVar28;
        moved.d._0_4_ = SUB84(pDVar13,0);
        moved.d._4_4_ = (undefined4)((ulong)pDVar13 >> 0x20);
        moved.m_size._0_4_ = SUB84(pPVar14,0);
        moved.m_size._4_4_ = (undefined4)((ulong)pPVar14 >> 0x20);
        QArrayDataPointer<QCss::PageRule>::~QArrayDataPointer
                  ((QArrayDataPointer<QCss::PageRule> *)&moved);
        local_1e8.animationRules.d.size = local_90.size;
        pAVar30 = local_90.ptr;
        pDVar29 = local_90.d;
        pAVar16 = local_1e8.animationRules.d.ptr;
        pDVar15 = local_1e8.animationRules.d.d;
        local_90.d = (Data *)0x0;
        local_90.ptr = (AnimationRule *)0x0;
        local_90.size = 0;
        local_1e8.animationRules.d.d = pDVar29;
        local_1e8.animationRules.d.ptr = pAVar30;
        moved.d._0_4_ = SUB84(pDVar15,0);
        moved.d._4_4_ = (undefined4)((ulong)pDVar15 >> 0x20);
        moved.m_size._0_4_ = SUB84(pAVar16,0);
        moved.m_size._4_4_ = (undefined4)((ulong)pAVar16 >> 0x20);
        QArrayDataPointer<QCss::AnimationRule>::~QArrayDataPointer
                  ((QArrayDataPointer<QCss::AnimationRule> *)&moved);
        local_1e8.importRules.d.size = local_78.size;
        pIVar32 = local_78.ptr;
        pDVar31 = local_78.d;
        pIVar18 = local_1e8.importRules.d.ptr;
        pDVar17 = local_1e8.importRules.d.d;
        local_78.d = (Data *)0x0;
        local_78.ptr = (ImportRule *)0x0;
        local_78.size = 0;
        local_1e8.importRules.d.d = pDVar31;
        local_1e8.importRules.d.ptr = pIVar32;
        moved.d._0_4_ = SUB84(pDVar17,0);
        moved.d._4_4_ = (undefined4)((ulong)pDVar17 >> 0x20);
        moved.m_size._0_4_ = SUB84(pIVar18,0);
        moved.m_size._4_4_ = (undefined4)((ulong)pIVar18 >> 0x20);
        QArrayDataPointer<QCss::ImportRule>::~QArrayDataPointer
                  ((QArrayDataPointer<QCss::ImportRule> *)&moved);
        qVar34 = local_58.m_size;
        pDVar33 = local_58.d;
        qVar20 = local_1e8.nameIndex.m_size;
        pDVar19 = local_1e8.nameIndex.d;
        local_1e8.origin = (StyleSheetOrigin)local_60;
        local_1e8.depth = local_60._4_4_;
        local_58.d = (Data *)0x0;
        local_58.m_size = 0;
        local_1e8.nameIndex.d = pDVar33;
        local_1e8.nameIndex.m_size = qVar34;
        moved.d._0_4_ = SUB84(pDVar19,0);
        moved.d._4_4_ = (undefined4)((ulong)pDVar19 >> 0x20);
        moved.m_size._0_4_ = (undefined4)qVar20;
        moved.m_size._4_4_ = (undefined4)((ulong)qVar20 >> 0x20);
        QMultiHash<QString,_QCss::StyleRule>::~QMultiHash(&moved);
        qVar34 = local_48.m_size;
        pDVar33 = local_48.d;
        qVar20 = local_1e8.idIndex.m_size;
        pDVar19 = local_1e8.idIndex.d;
        local_48.d = (Data *)0x0;
        local_48.m_size = 0;
        local_1e8.idIndex.d = pDVar33;
        local_1e8.idIndex.m_size = qVar34;
        moved.d._0_4_ = SUB84(pDVar19,0);
        moved.d._4_4_ = (undefined4)((ulong)pDVar19 >> 0x20);
        moved.m_size._0_4_ = (undefined4)qVar20;
        moved.m_size._4_4_ = (undefined4)((ulong)qVar20 >> 0x20);
        QMultiHash<QString,_QCss::StyleRule>::~QMultiHash(&moved);
        QMultiHash<QString,_QCss::StyleRule>::~QMultiHash(&local_48);
        QMultiHash<QString,_QCss::StyleRule>::~QMultiHash(&local_58);
        QArrayDataPointer<QCss::ImportRule>::~QArrayDataPointer(&local_78);
        QArrayDataPointer<QCss::AnimationRule>::~QArrayDataPointer(&local_90);
        QArrayDataPointer<QCss::PageRule>::~QArrayDataPointer(&local_a8);
        QArrayDataPointer<QCss::MediaRule>::~QArrayDataPointer(&local_c0);
        QArrayDataPointer<QCss::StyleRule>::~QArrayDataPointer
                  ((QArrayDataPointer<QCss::StyleRule> *)&copy);
        pQVar37 = baseStyle(this);
        copy = pQVar37;
        QHash<void_const*,QCss::StyleSheet>::emplace<QCss::StyleSheet_const&>
                  ((QHash<void_const*,QCss::StyleSheet> *)&styleSheetCaches->styleSheetCache,&copy,
                   &local_1e8);
        pQVar9 = styleSheetCaches;
        moved.d._0_4_ = 0x359ca0;
        moved.d._4_4_ = 0;
        moved.m_size._0_4_ = 0;
        moved.m_size._4_4_ = 0;
        copy = QObject::destroyed;
        local_d0 = (StyleRule *)0x0;
        puVar38 = (undefined4 *)operator_new(0x20);
        *puVar38 = 1;
        *(code **)(puVar38 + 2) =
             QtPrivate::
             QCallableObject<void_(QStyleSheetStyleCaches::*)(QObject_*),_QtPrivate::List<QObject_*>,_void>
             ::impl;
        *(code **)(puVar38 + 4) = QStyleSheetStyleCaches::styleDestroyed;
        *(undefined8 *)(puVar38 + 6) = 0;
        QObject::connectImpl
                  (local_1f0,(void **)pQVar37,(QObject *)&copy,(void **)pQVar9,
                   (QSlotObjectBase *)&moved,(ConnectionType)puVar38,(int *)0x0,(QMetaObject *)0x0);
        QMetaObject::Connection::~Connection((Connection *)local_1f0);
      }
      else {
        pSVar6 = (cVar48.i.d)->spans;
        uVar41 = cVar48.i.bucket >> 7;
        pEVar7 = pSVar6[uVar41].entries;
        bVar2 = pSVar6[uVar41].offsets[(uint)cVar48.i.bucket & 0x7f];
        QArrayDataPointer<QCss::StyleRule>::operator=
                  ((QArrayDataPointer<QCss::StyleRule> *)&local_1e8,
                   (QArrayDataPointer<QCss::StyleRule> *)(pEVar7[bVar2].storage.data + 8));
        QArrayDataPointer<QCss::MediaRule>::operator=
                  (&local_1e8.mediaRules.d,
                   (QArrayDataPointer<QCss::MediaRule> *)(pEVar7[bVar2].storage.data + 0x20));
        QArrayDataPointer<QCss::PageRule>::operator=
                  (&local_1e8.pageRules.d,
                   (QArrayDataPointer<QCss::PageRule> *)(pEVar7[bVar2].storage.data + 0x38));
        QArrayDataPointer<QCss::AnimationRule>::operator=
                  (&local_1e8.animationRules.d,
                   (QArrayDataPointer<QCss::AnimationRule> *)(pEVar7[bVar2].storage.data + 0x50));
        QArrayDataPointer<QCss::ImportRule>::operator=
                  (&local_1e8.importRules.d,
                   (QArrayDataPointer<QCss::ImportRule> *)(pEVar7[bVar2].storage.data + 0x68));
        local_1e8._120_8_ = *(undefined8 *)(pEVar7[bVar2].storage.data + 0x80);
        QMultiHash<QString,_QCss::StyleRule>::operator=
                  (&local_1e8.nameIndex,
                   (QMultiHash<QString,_QCss::StyleRule> *)(pEVar7[bVar2].storage.data + 0x88));
        QMultiHash<QString,_QCss::StyleRule>::operator=
                  (&local_1e8.idIndex,
                   (QMultiHash<QString,_QCss::StyleRule> *)(pEVar7[bVar2].storage.data + 0x98));
      }
      QtPrivate::QMovableArrayOps<QCss::StyleSheet>::emplace<QCss::StyleSheet_const&>
                ((QMovableArrayOps<QCss::StyleSheet> *)&styleSelector.field_0x8,styleSelector._24_8_
                 ,&local_1e8);
      QList<QCss::StyleSheet>::end((QList<QCss::StyleSheet> *)&styleSelector.field_0x8);
      QApplication::styleSheet((QString *)&copy,QCoreApplication::self);
      lVar46 = lStack_c8;
      if (copy != (void *)0x0) {
        LOCK();
        *(int *)copy = *copy + -1;
        UNLOCK();
        if (*copy == 0) {
          QArrayData::deallocate((QArrayData *)copy,2,0x10);
        }
      }
      if (lVar46 != 0) {
        memset(&copy,0xaa,0xa0);
        memset(&copy,0,0xa0);
        moved.d._0_4_ = SUB84(QCoreApplication::self,0);
        moved.d._4_4_ = (undefined4)((ulong)QCoreApplication::self >> 0x20);
        cVar48 = QHash<void_const*,QCss::StyleSheet>::constFindImpl<void_const*>
                           ((QHash<void_const*,QCss::StyleSheet> *)
                            &styleSheetCaches->styleSheetCache,&moved.d);
        if (cVar48.i.d == (Data<QHashPrivate::Node<const_void_*,_QCss::StyleSheet>_> *)0x0 &&
            cVar48.i.bucket == 0) {
          moved.d._0_4_ = 0xaaaaaaaa;
          moved.d._4_4_ = 0xaaaaaaaa;
          moved.m_size._0_4_ = 0xaaaaaaaa;
          moved.m_size._4_4_ = 0xaaaaaaaa;
          QApplication::styleSheet((QString *)&moved,QCoreApplication::self);
          QVar49.m_data = (char *)0x8;
          QVar49.m_size = (qsizetype)&moved;
          cVar36 = QString::startsWith(QVar49,0x66fb8a);
          if (cVar36 != '\0') {
            QString::remove((longlong)&moved,0);
          }
          QApplication::styleSheet((QString *)&copy_1,QCoreApplication::self);
          if (local_1f8 == &DAT_aaaaaaaaaaaaaaaa) {
            QVar51.m_data._4_4_ = moved.m_size._4_4_;
            QVar51.m_data._0_4_ = (undefined4)moved.m_size;
            QVar50.m_data = (storage_type_conflict *)pSStack_200;
            QVar50.m_size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
            QVar51.m_size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
            QtPrivate::equalStrings(QVar50,QVar51);
          }
          QCss::Parser::init((QString *)(this + 0x20),SUB81(&moved,0));
          if (copy_1 != (void *)0x0) {
            LOCK();
            *(int *)copy_1 = *copy_1 + -1;
            UNLOCK();
            if (*copy_1 == 0) {
              QArrayData::deallocate((QArrayData *)copy_1,2,0x10);
            }
          }
          cVar36 = QCss::Parser::parse((StyleSheet *)(this + 0x20),(CaseSensitivity)&copy);
          if (cVar36 == '\0') {
            styleRules();
          }
          local_60._0_4_ = StyleSheetOrigin_Inline;
          local_60._4_4_ = 1;
          copy_1 = QCoreApplication::self;
          QHash<void_const*,QCss::StyleSheet>::emplace<QCss::StyleSheet_const&>
                    ((QHash<void_const*,QCss::StyleSheet> *)&styleSheetCaches->styleSheetCache,
                     &copy_1,(StyleSheet *)&copy);
          piVar8 = (int *)CONCAT44(moved.d._4_4_,moved.d._0_4_);
          if (piVar8 != (int *)0x0) {
            LOCK();
            *piVar8 = *piVar8 + -1;
            UNLOCK();
            if (*piVar8 == 0) {
              QArrayData::deallocate((QArrayData *)CONCAT44(moved.d._4_4_,moved.d._0_4_),2,0x10);
            }
          }
        }
        else {
          pSVar6 = (cVar48.i.d)->spans;
          uVar41 = cVar48.i.bucket >> 7;
          pEVar7 = pSVar6[uVar41].entries;
          bVar2 = pSVar6[uVar41].offsets[(uint)cVar48.i.bucket & 0x7f];
          QArrayDataPointer<QCss::StyleRule>::operator=
                    ((QArrayDataPointer<QCss::StyleRule> *)&copy,
                     (QArrayDataPointer<QCss::StyleRule> *)(pEVar7[bVar2].storage.data + 8));
          QArrayDataPointer<QCss::MediaRule>::operator=
                    (&local_c0,
                     (QArrayDataPointer<QCss::MediaRule> *)(pEVar7[bVar2].storage.data + 0x20));
          QArrayDataPointer<QCss::PageRule>::operator=
                    (&local_a8,
                     (QArrayDataPointer<QCss::PageRule> *)(pEVar7[bVar2].storage.data + 0x38));
          QArrayDataPointer<QCss::AnimationRule>::operator=
                    (&local_90,
                     (QArrayDataPointer<QCss::AnimationRule> *)(pEVar7[bVar2].storage.data + 0x50));
          QArrayDataPointer<QCss::ImportRule>::operator=
                    (&local_78,
                     (QArrayDataPointer<QCss::ImportRule> *)(pEVar7[bVar2].storage.data + 0x68));
          local_60 = *(undefined8 *)(pEVar7[bVar2].storage.data + 0x80);
          QMultiHash<QString,_QCss::StyleRule>::operator=
                    (&local_58,
                     (QMultiHash<QString,_QCss::StyleRule> *)(pEVar7[bVar2].storage.data + 0x88));
          QMultiHash<QString,_QCss::StyleRule>::operator=
                    (&local_48,
                     (QMultiHash<QString,_QCss::StyleRule> *)(pEVar7[bVar2].storage.data + 0x98));
        }
        QtPrivate::QMovableArrayOps<QCss::StyleSheet>::emplace<QCss::StyleSheet_const&>
                  ((QMovableArrayOps<QCss::StyleSheet> *)&styleSelector.field_0x8,
                   styleSelector._24_8_,(StyleSheet *)&copy);
        QList<QCss::StyleSheet>::end((QList<QCss::StyleSheet> *)&styleSelector.field_0x8);
        QMultiHash<QString,_QCss::StyleRule>::~QMultiHash(&local_48);
        QMultiHash<QString,_QCss::StyleRule>::~QMultiHash(&local_58);
        QArrayDataPointer<QCss::ImportRule>::~QArrayDataPointer(&local_78);
        QArrayDataPointer<QCss::AnimationRule>::~QArrayDataPointer(&local_90);
        QArrayDataPointer<QCss::PageRule>::~QArrayDataPointer(&local_a8);
        QArrayDataPointer<QCss::MediaRule>::~QArrayDataPointer(&local_c0);
        QArrayDataPointer<QCss::StyleRule>::~QArrayDataPointer
                  ((QArrayDataPointer<QCss::StyleRule> *)&copy);
      }
      copy_1 = (void *)0x0;
      pSStack_200 = (StyleSheet *)0x0;
      local_1f8 = (undefined1 *)0x0;
      if (obj_local != (QObject *)0x0) {
        pSVar1 = (StyleSheet *)(this + 0x20);
        obj_00 = obj_local;
        do {
          local_218 = &DAT_aaaaaaaaaaaaaaaa;
          local_228 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
          puStack_220 = &DAT_aaaaaaaaaaaaaaaa;
          QObject::property((char *)&copy);
          ::QVariant::toString();
          ::QVariant::~QVariant((QVariant *)&copy);
          if (local_218 != (undefined1 *)0x0) {
            memset((StyleSheet *)&copy,0xaa,0xa0);
            memset((StyleSheet *)&copy,0,0xa0);
            moved.d._0_4_ = SUB84(obj_00,0);
            uVar21 = moved.d._0_4_;
            moved.d._4_4_ = (undefined4)((ulong)obj_00 >> 0x20);
            uVar22 = moved.d._4_4_;
            cVar48 = QHash<void_const*,QCss::StyleSheet>::constFindImpl<void_const*>
                               ((QHash<void_const*,QCss::StyleSheet> *)
                                &styleSheetCaches->styleSheetCache,&moved.d);
            if (cVar48.i.d == (Data<QHashPrivate::Node<const_void_*,_QCss::StyleSheet>_> *)0x0 &&
                cVar48.i.bucket == 0) {
              QCss::Parser::init((QString *)pSVar1,SUB81(&local_228,0));
              CVar43 = (CaseSensitivity)(StyleSheet *)&copy;
              cVar36 = QCss::Parser::parse(pSVar1,CVar43);
              if (cVar36 == '\0') {
                moved.d._0_4_ = 3;
                moved.d._4_4_ = 0;
                moved.m_size._0_4_ = 0x6801e7;
                moved.m_size._4_4_ = 0;
                QStringBuilder<QStringBuilder<QLatin1String,_QString_&>,_char16_t>::
                convertTo<QString>(&local_240,
                                   (QStringBuilder<QStringBuilder<QLatin1String,_QString_&>,_char16_t>
                                    *)&moved);
                QCss::Parser::init((QString *)pSVar1,SUB81(&local_240,0));
                if (&(local_240.d.d)->super_QArrayData != (QArrayData *)0x0) {
                  LOCK();
                  ((local_240.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                       ((local_240.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                       _M_i + -1;
                  UNLOCK();
                  if (((local_240.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                      _M_i == 0) {
                    QArrayData::deallocate(&(local_240.d.d)->super_QArrayData,2,0x10);
                  }
                }
                cVar36 = QCss::Parser::parse(pSVar1,CVar43);
                if (cVar36 == '\0') {
                  moved.d._0_4_ = 2;
                  moved.d._4_4_ = 0;
                  moved.m_size._0_4_ = 0;
                  moved.m_size._4_4_ = 0;
                  QMessageLogger::warning();
                  pQVar39 = QDebug::operator<<((QDebug *)&local_240,
                                               "Could not parse stylesheet of object");
                  local_250 = pQVar39->stream;
                  *(int *)(local_250 + 0x28) = *(int *)(local_250 + 0x28) + 1;
                  ::operator<<((Stream *)local_248,(QObject *)&local_250);
                  QDebug::~QDebug((QDebug *)local_248);
                  QDebug::~QDebug((QDebug *)&local_250);
                  QDebug::~QDebug((QDebug *)&local_240);
                }
              }
              local_60._0_4_ = StyleSheetOrigin_Inline;
              moved.d._0_4_ = uVar21;
              moved.d._4_4_ = uVar22;
              QHash<void_const*,QCss::StyleSheet>::emplace<QCss::StyleSheet_const&>
                        ((QHash<void_const*,QCss::StyleSheet> *)&styleSheetCaches->styleSheetCache,
                         &moved.d,(StyleSheet *)&copy);
            }
            else {
              pSVar6 = (cVar48.i.d)->spans;
              uVar41 = cVar48.i.bucket >> 7;
              pEVar7 = pSVar6[uVar41].entries;
              bVar2 = pSVar6[uVar41].offsets[(uint)cVar48.i.bucket & 0x7f];
              QArrayDataPointer<QCss::StyleRule>::operator=
                        ((QArrayDataPointer<QCss::StyleRule> *)&copy,
                         (QArrayDataPointer<QCss::StyleRule> *)(pEVar7[bVar2].storage.data + 8));
              QArrayDataPointer<QCss::MediaRule>::operator=
                        (&local_c0,
                         (QArrayDataPointer<QCss::MediaRule> *)(pEVar7[bVar2].storage.data + 0x20));
              QArrayDataPointer<QCss::PageRule>::operator=
                        (&local_a8,
                         (QArrayDataPointer<QCss::PageRule> *)(pEVar7[bVar2].storage.data + 0x38));
              QArrayDataPointer<QCss::AnimationRule>::operator=
                        (&local_90,
                         (QArrayDataPointer<QCss::AnimationRule> *)
                         (pEVar7[bVar2].storage.data + 0x50));
              QArrayDataPointer<QCss::ImportRule>::operator=
                        (&local_78,
                         (QArrayDataPointer<QCss::ImportRule> *)(pEVar7[bVar2].storage.data + 0x68))
              ;
              local_60 = *(undefined8 *)(pEVar7[bVar2].storage.data + 0x80);
              QMultiHash<QString,_QCss::StyleRule>::operator=
                        (&local_58,
                         (QMultiHash<QString,_QCss::StyleRule> *)(pEVar7[bVar2].storage.data + 0x88)
                        );
              QMultiHash<QString,_QCss::StyleRule>::operator=
                        (&local_48,
                         (QMultiHash<QString,_QCss::StyleRule> *)(pEVar7[bVar2].storage.data + 0x98)
                        );
            }
            QtPrivate::QMovableArrayOps<QCss::StyleSheet>::emplace<QCss::StyleSheet_const&>
                      ((QMovableArrayOps<QCss::StyleSheet> *)&copy_1,(qsizetype)local_1f8,
                       (StyleSheet *)&copy);
            QList<QCss::StyleSheet>::end((QList<QCss::StyleSheet> *)&copy_1);
            QMultiHash<QString,_QCss::StyleRule>::~QMultiHash(&local_48);
            QMultiHash<QString,_QCss::StyleRule>::~QMultiHash(&local_58);
            QArrayDataPointer<QCss::ImportRule>::~QArrayDataPointer(&local_78);
            QArrayDataPointer<QCss::AnimationRule>::~QArrayDataPointer(&local_90);
            QArrayDataPointer<QCss::PageRule>::~QArrayDataPointer(&local_a8);
            QArrayDataPointer<QCss::MediaRule>::~QArrayDataPointer(&local_c0);
            QArrayDataPointer<QCss::StyleRule>::~QArrayDataPointer
                      ((QArrayDataPointer<QCss::StyleRule> *)&copy);
          }
          if (local_228 != (QArrayData *)0x0) {
            LOCK();
            (local_228->ref_)._q_value.super___atomic_base<int>._M_i =
                 (local_228->ref_)._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((local_228->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(local_228,2,0x10);
            }
          }
          obj_00 = parentObject(obj_00);
        } while (obj_00 != (QObject *)0x0);
      }
      if (local_1f8 != (undefined1 *)0x0) {
        lVar46 = 0x7c;
        iVar42 = 2;
        puVar45 = (undefined1 *)0x0;
        do {
          iVar44 = (int)local_1f8;
          pSVar40 = QList<QCss::StyleSheet>::data((QList<QCss::StyleSheet> *)&copy_1);
          *(int *)((long)&(pSVar40->styleRules).d.d + lVar46) = iVar44 + iVar42;
          puVar45 = puVar45 + 1;
          lVar46 = lVar46 + 0xa0;
          iVar42 = iVar42 + -1;
        } while (puVar45 < local_1f8);
      }
      QtPrivate::QCommonArrayOps<QCss::StyleSheet>::growAppend
                ((QCommonArrayOps<QCss::StyleSheet> *)&styleSelector.field_0x8,pSStack_200,
                 pSStack_200 + (long)local_1f8);
      (__return_storage_ptr__->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      (__return_storage_ptr__->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      (__return_storage_ptr__->d).ptr = (StyleRule *)&DAT_aaaaaaaaaaaaaaaa;
      QCss::StyleSelector::styleRulesForNode((NodePtr)__return_storage_ptr__);
      copy = obj_local;
      QHash<QObject_const*,QList<QCss::StyleRule>>::emplace<QList<QCss::StyleRule>const&>
                ((QHash<QObject_const*,QList<QCss::StyleRule>> *)&styleSheetCaches->styleRulesCache,
                 (QObject **)&copy,__return_storage_ptr__);
      QArrayDataPointer<QCss::StyleSheet>::~QArrayDataPointer
                ((QArrayDataPointer<QCss::StyleSheet> *)&copy_1);
      QMultiHash<QString,_QCss::StyleRule>::~QMultiHash(&local_1e8.idIndex);
      QMultiHash<QString,_QCss::StyleRule>::~QMultiHash(&local_1e8.nameIndex);
      QArrayDataPointer<QCss::ImportRule>::~QArrayDataPointer(&local_1e8.importRules.d);
      QArrayDataPointer<QCss::AnimationRule>::~QArrayDataPointer(&local_1e8.animationRules.d);
      QArrayDataPointer<QCss::PageRule>::~QArrayDataPointer(&local_1e8.pageRules.d);
      QArrayDataPointer<QCss::MediaRule>::~QArrayDataPointer(&local_1e8.mediaRules.d);
      QArrayDataPointer<QCss::StyleRule>::~QArrayDataPointer
                ((QArrayDataPointer<QCss::StyleRule> *)&local_1e8);
      styleSelector._0_8_ = &PTR__QStyleSheetStyleSelector_007f8240;
      QHash<const_QObject_*,_QHash<QString,_QString>_>::~QHash(&styleSelector.m_attributeCache);
      QCss::StyleSelector::~StyleSelector(&styleSelector.super_StyleSelector);
    }
    else {
      (__return_storage_ptr__->d).d = (Data *)0x0;
      (__return_storage_ptr__->d).ptr = (StyleRule *)0x0;
      (__return_storage_ptr__->d).size = 0;
    }
  }
  else {
    pSVar3 = (cVar47.i.d)->spans;
    uVar41 = cVar47.i.bucket >> 7;
    pEVar4 = pSVar3[uVar41].entries;
    bVar2 = pSVar3[uVar41].offsets[(uint)cVar47.i.bucket & 0x7f];
    pDVar5 = *(Data **)(pEVar4[bVar2].storage.data + 8);
    (__return_storage_ptr__->d).d = pDVar5;
    (__return_storage_ptr__->d).ptr = *(StyleRule **)(pEVar4[bVar2].storage.data + 0x10);
    (__return_storage_ptr__->d).size = *(qsizetype *)(pEVar4[bVar2].storage.data + 0x18);
    if (pDVar5 != (Data *)0x0) {
      LOCK();
      (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

QList<QCss::StyleRule> QStyleSheetStyle::styleRules(const QObject *obj) const
{
    QHash<const QObject *, QList<StyleRule>>::const_iterator cacheIt =
            styleSheetCaches->styleRulesCache.constFind(obj);
    if (cacheIt != styleSheetCaches->styleRulesCache.constEnd())
        return cacheIt.value();

    if (!initObject(obj)) {
        return QList<StyleRule>();
    }

    QStyleSheetStyleSelector styleSelector;

    StyleSheet defaultSs;
    QHash<const void *, StyleSheet>::const_iterator defaultCacheIt = styleSheetCaches->styleSheetCache.constFind(baseStyle());
    if (defaultCacheIt == styleSheetCaches->styleSheetCache.constEnd()) {
        defaultSs = getDefaultStyleSheet();
        QStyle *bs = baseStyle();
        styleSheetCaches->styleSheetCache.insert(bs, defaultSs);
        QObject::connect(bs, &QStyle::destroyed, styleSheetCaches,
                         &QStyleSheetStyleCaches::styleDestroyed);
    } else {
        defaultSs = defaultCacheIt.value();
    }
    styleSelector.styleSheets += defaultSs;

    if (!qApp->styleSheet().isEmpty()) {
        StyleSheet appSs;
        QHash<const void *, StyleSheet>::const_iterator appCacheIt = styleSheetCaches->styleSheetCache.constFind(qApp);
        if (appCacheIt == styleSheetCaches->styleSheetCache.constEnd()) {
            QString ss = qApp->styleSheet();
            if (ss.startsWith("file:///"_L1))
                ss.remove(0, 8);
            parser.init(ss, qApp->styleSheet() != ss);
            if (Q_UNLIKELY(!parser.parse(&appSs)))
                qWarning("Could not parse application stylesheet");
            appSs.origin = StyleSheetOrigin_Inline;
            appSs.depth = 1;
            styleSheetCaches->styleSheetCache.insert(qApp, appSs);
        } else {
            appSs = appCacheIt.value();
        }
        styleSelector.styleSheets += appSs;
    }

    QList<QCss::StyleSheet> objectSs;
    for (const QObject *o = obj; o; o = parentObject(o)) {
        QString styleSheet = o->property("styleSheet").toString();
        if (styleSheet.isEmpty())
            continue;
        StyleSheet ss;
        QHash<const void *, StyleSheet>::const_iterator objCacheIt = styleSheetCaches->styleSheetCache.constFind(o);
        if (objCacheIt == styleSheetCaches->styleSheetCache.constEnd()) {
            parser.init(styleSheet);
            if (!parser.parse(&ss)) {
                parser.init("* {"_L1 + styleSheet + u'}');
                if (Q_UNLIKELY(!parser.parse(&ss)))
                   qWarning() << "Could not parse stylesheet of object" << o;
            }
            ss.origin = StyleSheetOrigin_Inline;
            styleSheetCaches->styleSheetCache.insert(o, ss);
        } else {
            ss = objCacheIt.value();
        }
        objectSs.append(ss);
    }

    for (int i = 0; i < objectSs.size(); i++)
        objectSs[i].depth = objectSs.size() - i + 2;

    styleSelector.styleSheets += objectSs;

    StyleSelector::NodePtr n;
    n.ptr = const_cast<QObject *>(obj);
    QList<QCss::StyleRule> rules = styleSelector.styleRulesForNode(n);
    styleSheetCaches->styleRulesCache.insert(obj, rules);
    return rules;
}